

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void * nk_buffer_alloc(nk_buffer *b,nk_buffer_allocation_type type,nk_size size,nk_size align)

{
  nk_plugin_alloc p_Var1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  nk_size back_size;
  nk_size nVar6;
  void *pvVar7;
  long lVar8;
  nk_size nVar9;
  void *pvVar10;
  float fVar11;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x151f,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  if (size == 0) {
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x1520,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  b->needed = b->needed + size;
  pvVar3 = (b->memory).ptr;
  if (type == NK_BUFFER_FRONT) {
    uVar4 = b->allocated;
    pvVar7 = (void *)((long)pvVar3 + uVar4);
    pvVar10 = (void *)(-align & (long)pvVar7 + (align - 1));
    lVar8 = (long)pvVar10 - (long)pvVar7;
    if (align == 0) {
      lVar8 = 0;
      pvVar10 = pvVar7;
    }
    if (b->size < uVar4 + size + lVar8) goto LAB_00119b2b;
  }
  else {
    nVar9 = b->size;
    pvVar7 = (void *)((nVar9 - size) + (long)pvVar3);
    if (type == NK_BUFFER_BACK) {
      if (align == 0) {
LAB_00119b13:
        lVar8 = 0;
        pvVar10 = pvVar7;
      }
      else {
        lVar8 = (long)pvVar7 - (long)(-align & (ulong)pvVar7);
        pvVar10 = (void *)(-align & (ulong)pvVar7);
      }
    }
    else {
      if (align == 0) goto LAB_00119b13;
      pvVar10 = (void *)(-align & (long)pvVar7 + (align - 1));
      lVar8 = (long)pvVar10 - (long)pvVar7;
    }
    uVar4 = b->allocated;
    if (uVar4 < (nVar9 - lVar8) - size) goto LAB_00119c96;
LAB_00119b2b:
    if (b->type != NK_BUFFER_DYNAMIC) {
      __assert_fail("b->type == NK_BUFFER_DYNAMIC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x1531,
                    "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                   );
    }
    p_Var1 = (b->pool).alloc;
    if ((p_Var1 == (nk_plugin_alloc)0x0) || ((b->pool).free == (nk_plugin_free)0x0)) {
      __assert_fail("b->pool.alloc && b->pool.free",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x1532,
                    "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                   );
    }
    nVar6 = (b->memory).size;
    fVar11 = (float)nVar6 * b->grow_factor;
    uVar5 = (ulong)fVar11;
    nVar9 = (long)(fVar11 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
    uVar2 = ((int)uVar4 + (int)size) - 1;
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar4 = (ulong)((uVar2 >> 0x10 | uVar2) + 1);
    if (nVar9 <= uVar4) {
      nVar9 = uVar4;
    }
    pvVar3 = (*p_Var1)((b->pool).userdata,pvVar3,nVar9);
    if (pvVar3 == (void *)0x0) {
      __assert_fail("temp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x14fc,"void *nk_buffer_realloc(struct nk_buffer *, nk_size, nk_size *)");
    }
    (b->memory).size = nVar9;
    pvVar7 = (b->memory).ptr;
    if (pvVar3 != pvVar7) {
      nk_memcopy(pvVar3,pvVar7,nVar6);
      (*(b->pool).free)((b->pool).userdata,(b->memory).ptr);
    }
    nVar6 = nVar6 - b->size;
    if (nVar6 != 0) {
      nVar9 = nVar9 - nVar6;
      nk_memcopy((void *)((long)pvVar3 + nVar9),(void *)(b->size + (long)pvVar3),nVar6);
    }
    b->size = nVar9;
    (b->memory).ptr = pvVar3;
    if (type != NK_BUFFER_FRONT) {
      pvVar3 = (void *)((long)pvVar3 + (nVar9 - size));
      if (type == NK_BUFFER_BACK) {
        if (align == 0) {
LAB_00119c94:
          lVar8 = 0;
          pvVar10 = pvVar3;
        }
        else {
          pvVar10 = (void *)(-align & (ulong)pvVar3);
          lVar8 = (long)pvVar3 - (long)pvVar10;
        }
      }
      else {
        if (align == 0) goto LAB_00119c94;
        pvVar10 = (void *)(-align & (long)pvVar3 + (align - 1));
        lVar8 = (long)pvVar10 - (long)pvVar3;
      }
LAB_00119c96:
      b->size = nVar9 - (size + lVar8);
      goto LAB_00119cae;
    }
    uVar4 = b->allocated;
    pvVar10 = (void *)((long)pvVar3 + uVar4);
    if (align == 0) {
      lVar8 = 0;
    }
    else {
      pvVar3 = (void *)(-align & (long)pvVar10 + (align - 1));
      lVar8 = (long)pvVar3 - (long)pvVar10;
      pvVar10 = pvVar3;
    }
  }
  b->allocated = size + uVar4 + lVar8;
LAB_00119cae:
  b->needed = lVar8 + b->needed;
  b->calls = b->calls + 1;
  return pvVar10;
}

Assistant:

NK_INTERN void*
nk_buffer_alloc(struct nk_buffer *b, enum nk_buffer_allocation_type type,
    nk_size size, nk_size align)
{
    int full;
    nk_size alignment;
    void *unaligned;
    void *memory;

    NK_ASSERT(b);
    NK_ASSERT(size);
    if (!b || !size) return 0;
    b->needed += size;

    /* calculate total size with needed alignment + size */
    if (type == NK_BUFFER_FRONT)
        unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
    else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
    memory = nk_buffer_align(unaligned, align, &alignment, type);

    /* check if buffer has enough memory*/
    if (type == NK_BUFFER_FRONT)
        full = ((b->allocated + size + alignment) > b->size);
    else full = ((b->size - (size + alignment)) <= b->allocated);

    if (full) {
        nk_size capacity;
        NK_ASSERT(b->type == NK_BUFFER_DYNAMIC);
        NK_ASSERT(b->pool.alloc && b->pool.free);
        if (b->type != NK_BUFFER_DYNAMIC || !b->pool.alloc || !b->pool.free)
            return 0;

        /* buffer is full so allocate bigger buffer if dynamic */
        capacity = (nk_size)((float)b->memory.size * b->grow_factor);
        capacity = NK_MAX(capacity, nk_round_up_pow2((nk_uint)(b->allocated + size)));
        b->memory.ptr = nk_buffer_realloc(b, capacity, &b->memory.size);
        if (!b->memory.ptr) return 0;

        /* align newly allocated pointer */
        if (type == NK_BUFFER_FRONT)
            unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
        else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
        memory = nk_buffer_align(unaligned, align, &alignment, type);
    }

    if (type == NK_BUFFER_FRONT)
        b->allocated += size + alignment;
    else b->size -= (size + alignment);
    b->needed += alignment;
    b->calls++;
    return memory;
}